

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,EventTriggerStatement *stmt)

{
  TimingControl *this_00;
  NonProceduralExprVisitor local_20;
  
  this_00 = stmt->timing;
  if (this_00 != (TimingControl *)0x0) {
    if (this_00->kind == Invalid) {
      (this->
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>)
      .super_FlowAnalysisBase.bad = true;
    }
    else {
      local_20.context = this->context;
      local_20.containingSymbol =
           (this->
           super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           ).super_FlowAnalysisBase.rootSymbol;
      ast::TimingControl::visit<slang::analysis::NonProceduralExprVisitor>(this_00,&local_20);
    }
  }
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (stmt->target,stmt->target,this);
  return;
}

Assistant:

void DataFlowAnalysis::handle(const EventTriggerStatement& stmt) {
    if (stmt.timing)
        handleTiming(*stmt.timing);
    visitStmt(stmt);
}